

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O3

bool __thiscall
create::Create::defineSong
          (Create *this,uint8_t *songNumber,uint8_t *songLength,uint8_t *notes,float *durations)

{
  float fVar1;
  uint8_t uVar2;
  pointer puVar3;
  ssize_t sVar4;
  pointer __n;
  undefined1 uVar5;
  int __flags;
  vector<unsigned_char,_std::allocator<unsigned_char>_> cmd;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  __flags = (int)durations;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,(ulong)*songLength * 2 + 3,&local_49);
  *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0x8c;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = *songNumber;
  uVar2 = *songLength;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = uVar2;
  __n = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  if (uVar2 != '\0') {
    puVar3 = (pointer)0x3;
    uVar5 = 0;
    do {
      fVar1 = *(float *)((long)durations + (long)puVar3 * 2 + -6);
      if ((fVar1 < 0.0) || (4.0 <= fVar1)) goto LAB_001317c3;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[(long)puVar3] = *notes;
      (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 1)[(long)puVar3] = (uchar)(int)(fVar1 * 64.0);
      puVar3 = puVar3 + 2;
      __n = (pointer)((ulong)*songLength * 2 + 3);
      notes = notes + 1;
    } while (puVar3 < __n);
  }
  sVar4 = Serial::send((this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(int)local_48.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                       (void *)(ulong)(uint)((int)local_48.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (int)local_48.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start),
                       (size_t)__n,__flags);
  uVar5 = (undefined1)sVar4;
LAB_001317c3:
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)uVar5;
}

Assistant:

bool Create::defineSong(const uint8_t& songNumber,
                          const uint8_t& songLength,
                          const uint8_t* notes,
                          const float* durations) const {
    int i, j;
    uint8_t duration;
    std::vector<uint8_t> cmd(2 * songLength + 3);
    cmd[0] = OC_SONG;
    cmd[1] = songNumber;
    cmd[2] = songLength;
    j = 0;
    for (i = 3; i < 2 * songLength + 3; i = i + 2) {
      if (durations[j] < 0 || durations[j] >= 4)
        return false;
      duration = durations[j] * 64;
      cmd[i] = notes[j];
      cmd[i + 1] = duration;
      j++;
    }

    return serial->send(cmd.data(), cmd.size());
  }